

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.cpp
# Opt level: O0

void __thiscall sjtu::TrainManager::refund_ticket(TrainManager *this,orderType *order)

{
  byte bVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  long in_RSI;
  long in_RDI;
  pair<long,_bool> pVar7;
  int i;
  bool flag;
  int day_id;
  trainType *train;
  pair<long,_bool> ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  allocator *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  StringHasher *in_stack_fffffffffffffe30;
  string *in_stack_fffffffffffffe38;
  allocator *paVar8;
  trainType *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>
  *in_stack_fffffffffffffe80;
  allocator local_141;
  string local_140 [39];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  int local_a8;
  byte local_a2;
  allocator local_a1;
  string local_a0 [36];
  int local_7c;
  long local_78;
  long local_70;
  undefined1 local_68;
  allocator local_49;
  string local_48 [32];
  hashType local_28;
  long local_20;
  undefined1 local_18;
  long local_10;
  
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,(char *)(in_RSI + 0x15),&local_49);
  local_28 = StringHasher::operator()
                       (in_stack_fffffffffffffe30,
                        (string *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  pVar7 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (in_stack_fffffffffffffe80,
                     (unsigned_long_long *)
                     CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  local_70 = pVar7.first;
  local_68 = pVar7.second;
  local_20 = local_70;
  local_18 = local_68;
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_78 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x10))(*(long **)(in_RDI + 0x20),&local_20);
  iVar3 = timeType::dateminus((timeType *)(local_10 + 0x2c),(timeType *)(local_78 + 0xa768));
  pcVar5 = (char *)(local_10 + 0x4c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,pcVar5,&local_a1);
  iVar4 = trainType::get_Delta_date(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  local_a2 = 0;
  local_7c = iVar3 + iVar4;
  for (local_a8 = 0; local_a8 < *(int *)(local_78 + 0x18); local_a8 = local_a8 + 1) {
    if ((local_a2 & 1) != 0) {
      lVar6 = local_78 + 0x20 + (long)local_a8 * 0x1a8;
      *(int *)(lVar6 + 0x2c + (long)local_7c * 4) =
           *(int *)(local_10 + 0xa0) + *(int *)(lVar6 + 0x2c + (long)local_7c * 4);
    }
    pcVar5 = (char *)(local_78 + 0x20 + (long)local_a8 * 0x1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,pcVar5,&local_c9);
    pcVar5 = (char *)(local_10 + 0x75);
    paVar8 = &local_f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f0,pcVar5,paVar8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    if ((bVar1 & 1) != 0) break;
    in_stack_fffffffffffffe18 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         (local_78 + 0x20 + (long)local_a8 * 0x1a8);
    in_stack_fffffffffffffe20 = &local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_118,(char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe20);
    pcVar5 = (char *)(local_10 + 0x4c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,pcVar5,&local_141);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    if (_Var2) {
      local_a2 = 1;
    }
  }
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x18))(*(long **)(in_RDI + 0x20),local_78 + 0xa7a0);
  return;
}

Assistant:

void TrainManager::refund_ticket(orderType *order)
	{
		auto ret = TrainBpTree -> find(hasher(order -> trainID));
		trainType *train = TrainFile -> read(ret.first);
		int day_id = timeType::dateminus(order -> date[0] , train -> saleDate[0]) + train -> get_Delta_date(std::string(order -> station[0]));
		bool flag = false;
		for (int i = 0;i < train -> stationNum;++ i)
		{
			if (flag) train -> stations[i].seatNum[day_id] += order -> num;
			if (std::string(train -> stations[i].stationName) == std::string(order -> station[1])) break;
			if (std::string(train -> stations[i].stationName) == std::string(order -> station[0])) flag = true;
		}
		TrainFile -> save(train -> offset);
	}